

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O0

gboolean socketNotifierSourceDispatch(GSource *source,GSourceFunc param_2,gpointer param_3)

{
  long lVar1;
  qsizetype qVar2;
  const_reference ppGVar3;
  long in_RDI;
  long in_FS_OFFSET;
  GPollFDWithQSocketNotifier *p;
  GSocketNotifierSource *src;
  QEvent event;
  QEvent *in_stack_ffffffffffffff98;
  QEvent *in_stack_ffffffffffffffa0;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)local_18,SockAct);
  *(undefined8 *)(in_RDI + 0x78) = 0;
  while( true ) {
    lVar1 = *(long *)(in_RDI + 0x78);
    qVar2 = QList<GPollFDWithQSocketNotifier_*>::size
                      ((QList<GPollFDWithQSocketNotifier_*> *)(in_RDI + 0x60));
    if (qVar2 <= lVar1) break;
    ppGVar3 = QList<GPollFDWithQSocketNotifier_*>::at
                        ((QList<GPollFDWithQSocketNotifier_*> *)in_stack_ffffffffffffffa0,
                         (qsizetype)in_stack_ffffffffffffff98);
    if ((((*ppGVar3)->pollfd).revents & ((*ppGVar3)->pollfd).events) != 0) {
      QCoreApplication::sendEvent((QObject *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    *(long *)(in_RDI + 0x78) = *(long *)(in_RDI + 0x78) + 1;
  }
  QEvent::~QEvent(in_stack_ffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return 1;
  }
  __stack_chk_fail();
}

Assistant:

static gboolean socketNotifierSourceDispatch(GSource *source, GSourceFunc, gpointer)
{
    QEvent event(QEvent::SockAct);

    GSocketNotifierSource *src = reinterpret_cast<GSocketNotifierSource *>(source);
    for (src->activeNotifierPos = 0; src->activeNotifierPos < src->pollfds.size();
         ++src->activeNotifierPos) {
        GPollFDWithQSocketNotifier *p = src->pollfds.at(src->activeNotifierPos);

        if ((p->pollfd.revents & p->pollfd.events) != 0)
            QCoreApplication::sendEvent(p->socketNotifier, &event);
    }

    return true; // ??? don't remove, right?
}